

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.h
# Opt level: O0

bool __thiscall
CCommandBuffer::AddCommand<CCommandBuffer::CTextureDestroyCommand>
          (CCommandBuffer *this,CTextureDestroyCommand *Command)

{
  long lVar1;
  uchar *puVar2;
  undefined8 *in_RSI;
  CBuffer *in_RDI;
  CTextureDestroyCommand *pCmd;
  bool local_1;
  
  puVar2 = (uchar *)CBuffer::Alloc(in_RDI,0x18,8);
  if (puVar2 == (uchar *)0x0) {
    local_1 = false;
  }
  else {
    *(undefined8 *)puVar2 = *in_RSI;
    *(undefined8 *)(puVar2 + 8) = in_RSI[1];
    *(undefined4 *)(puVar2 + 0x10) = *(undefined4 *)(in_RSI + 2);
    puVar2[8] = '\0';
    puVar2[9] = '\0';
    puVar2[10] = '\0';
    puVar2[0xb] = '\0';
    puVar2[0xc] = '\0';
    puVar2[0xd] = '\0';
    puVar2[0xe] = '\0';
    puVar2[0xf] = '\0';
    lVar1._0_4_ = in_RDI[2].m_Size;
    lVar1._4_4_ = in_RDI[2].m_Used;
    if (lVar1 != 0) {
      *(uchar **)(*(long *)&in_RDI[2].m_Size + 8) = puVar2;
    }
    if (in_RDI[2].m_pData == (uchar *)0x0) {
      in_RDI[2].m_pData = puVar2;
    }
    *(uchar **)&in_RDI[2].m_Size = puVar2;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool AddCommand(const T &Command)
	{
		// make sure that we don't do something stupid like ->AddCommand(&Cmd);
		(void)static_cast<const CCommand *>(&Command);

		// allocate and copy the command into the buffer
		T *pCmd = (T *)m_CmdBuffer.Alloc(sizeof(*pCmd), 8); // TODO: use alignof(T)
		if(!pCmd)
			return false;
		*pCmd = Command;
		pCmd->m_pNext = 0;

		if(m_pCmdBufferTail)
			m_pCmdBufferTail->m_pNext = pCmd;
		if(!m_pCmdBufferHead)
			m_pCmdBufferHead = pCmd;
		m_pCmdBufferTail = pCmd;

		return true;
	}